

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O1

void __thiscall
leveldb::VersionSet::AddLiveFiles
          (VersionSet *this,
          set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *live)

{
  long lVar1;
  Version *pVVar2;
  pointer ppFVar3;
  int level;
  long lVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  for (pVVar2 = (this->dummy_versions_).next_; pVVar2 != &this->dummy_versions_;
      pVVar2 = pVVar2->next_) {
    lVar4 = 0;
    do {
      ppFVar3 = pVVar2->files_[lVar4].
                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (pVVar2->files_[lVar4].
          super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
          _M_impl.super__Vector_impl_data._M_finish != ppFVar3) {
        uVar5 = 0;
        do {
          std::
          _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
          ::_M_insert_unique<unsigned_long_const&>
                    ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                      *)live,&ppFVar3[uVar5]->number);
          uVar5 = uVar5 + 1;
          ppFVar3 = pVVar2->files_[lVar4].
                    super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        } while (uVar5 < (ulong)((long)pVVar2->files_[lVar4].
                                       super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar3 >>
                                3));
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 7);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void VersionSet::AddLiveFiles(std::set<uint64_t>* live) {
  for (Version* v = dummy_versions_.next_; v != &dummy_versions_;
       v = v->next_) {
    for (int level = 0; level < config::kNumLevels; level++) {
      const std::vector<FileMetaData*>& files = v->files_[level];
      for (size_t i = 0; i < files.size(); i++) {
        live->insert(files[i]->number);
      }
    }
  }
}